

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_space.h
# Opt level: O0

void __thiscall
Small_Space<8U>::Check
          (Small_Space<8U> *this,HashMap<8U> *mp,
          vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
          *outs)

{
  bool bVar1;
  pointer ppVar2;
  int *piVar3;
  const_reference ppbVar4;
  ostream *poVar5;
  int iVar6;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *in_RDX;
  long *in_RDI;
  double dVar7;
  iterator it;
  int size;
  int hit;
  int all;
  int value;
  unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
  *in_stack_ffffffffffffff78;
  _Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true> *in_stack_ffffffffffffff80;
  int local_40 [2];
  _Node_iterator_base<std::pair<const_Data<8U>,_int>,_true> local_38;
  _Node_iterator_base<std::pair<const_Data<8U>,_int>,_true> local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_18;
  
  local_1c = 0;
  local_20 = 0;
  local_24 = 0;
  local_28 = 0;
  local_18 = in_RDX;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
       ::begin(in_stack_ffffffffffffff78);
  while( true ) {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<Data<8U>,_int,_My_Hash<8U>,_std::equal_to<Data<8U>_>,_std::allocator<std::pair<const_Data<8U>,_int>_>_>
         ::end(in_stack_ffffffffffffff78);
    bVar1 = std::__detail::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true> *)0x113403);
    local_1c = (**(code **)(*in_RDI + 0x10))(in_RDI,ppVar2);
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true> *)0x11341f);
    if (((int)in_RDI[0xd] < ppVar2->second) &&
       (local_20 = local_20 + 1, (int)in_RDI[0xd] < local_1c)) {
      local_24 = local_24 + 1;
      ppVar2 = std::__detail::_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true> *)0x113462);
      iVar6 = ppVar2->second - local_1c;
      if (iVar6 < 1) {
        iVar6 = -iVar6;
      }
      in_RDI[7] = (long)((double)iVar6 + (double)in_RDI[7]);
      ppVar2 = std::__detail::_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true> *)0x113490);
      iVar6 = ppVar2->second - local_1c;
      if (iVar6 < 1) {
        iVar6 = -iVar6;
      }
      ppVar2 = std::__detail::_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true> *)0x1134b2);
      in_RDI[8] = (long)((double)iVar6 / (double)ppVar2->second + (double)in_RDI[8]);
    }
    if ((int)in_RDI[0xd] < local_1c) {
      local_28 = local_28 + 1;
    }
    std::__detail::_Node_iterator<std::pair<const_Data<8U>,_int>,_false,_true>::operator++
              (in_stack_ffffffffffffff80);
  }
  in_RDI[7] = (long)((double)in_RDI[7] / (double)local_24);
  in_RDI[8] = (long)((double)in_RDI[8] / (double)local_24);
  dVar7 = (double)local_24;
  local_40[1] = 1;
  piVar3 = std::max<int>(local_40 + 1,&local_20);
  in_RDI[6] = (long)(dVar7 / (double)*piVar3);
  dVar7 = (double)local_24;
  local_40[0] = 1;
  piVar3 = std::max<int>(local_40,&local_28);
  in_RDI[5] = (long)(dVar7 / (double)*piVar3);
  ppbVar4 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,0);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar4,(double)in_RDI[6]);
  std::operator<<(poVar5,",");
  ppbVar4 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,1);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar4,(double)in_RDI[5]);
  std::operator<<(poVar5,",");
  ppbVar4 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,2);
  if (1e-09 <= (double)in_RDI[5] + (double)in_RDI[6]) {
    dVar7 = (double)in_RDI[5] + (double)in_RDI[6];
  }
  else {
    dVar7 = 1.0;
  }
  poVar5 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)*ppbVar4,((double)in_RDI[5] * 2.0 * (double)in_RDI[6]) / dVar7);
  std::operator<<(poVar5,",");
  ppbVar4 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,3);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar4,(double)in_RDI[8]);
  std::operator<<(poVar5,",");
  return;
}

Assistant:

void Check(HashMap<DATA_LEN> mp, const std::vector<std::ostream*>& outs) {
		int value = 0, all = 0, hit = 0, size = 0;
		for (typename HashMap<DATA_LEN>::iterator it = mp.begin(); it != mp.end(); ++it) {
			value = Query(it->first);
			if (it->second > this->HIT) {
				all++;
				if (value > this->HIT) {
					hit += 1;
					this->aae += abs(it->second - value);
					this->are += abs(it->second - value) / (double)it->second;
				}
			}
			if (value > this->HIT) size += 1;
		}
		this->aae /= hit;
		this->are /= hit;
		this->cr = hit / (double)std::max(1, all);
		this->pr = hit / (double)std::max(1, size);
		*outs[0] << this->cr << ",";
		*outs[1] << this->pr << ",";
		*outs[2] << 2 * this->pr * this->cr / ((this->pr + this->cr < 1e-9) ? 1.0 : this->pr + this->cr) << ",";
		*outs[3] << this->are << ",";
	}